

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Promise<kj::HttpClient::ConnectRequest::Status> * __thiscall
kj::_::NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>>::
emplace<kj::Promise<kj::HttpClient::ConnectRequest::Status>>
          (NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>> *this,
          Promise<kj::HttpClient::ConnectRequest::Status> *params)

{
  Promise<kj::HttpClient::ConnectRequest::Status> *params_00;
  Promise<kj::HttpClient::ConnectRequest::Status> *params_local;
  NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>>)0x0;
    dtor<kj::Promise<kj::HttpClient::ConnectRequest::Status>>
              ((Promise<kj::HttpClient::ConnectRequest::Status> *)(this + 8));
  }
  params_00 = fwd<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(params);
  ctor<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::HttpClient::ConnectRequest::Status>>
            ((Promise<kj::HttpClient::ConnectRequest::Status> *)(this + 8),params_00);
  *this = (NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>>)0x1;
  return (Promise<kj::HttpClient::ConnectRequest::Status> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }